

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void cconv_substruct_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,int32_t *ip,CTInfo flags)

{
  CType *d_00;
  uint uVar1;
  TValue *o;
  ushort uVar2;
  uint key;
  uint uVar3;
  bool bVar4;
  
  uVar2 = d->sib;
  do {
    if (uVar2 == 0) {
      return;
    }
    d_00 = cts->tab + uVar2;
    uVar2 = d_00->sib;
    if ((d_00->info >> 0x1c) - 9 < 2) {
      uVar3 = 2;
      if ((d_00->name).gcptr64 == 0) {
LAB_00146509:
        bVar4 = false;
      }
      else {
        uVar1 = *ip;
        key = uVar1;
        if ((int)uVar1 < 0) {
LAB_001464a5:
          o = lj_tab_getstr(t,(GCstr *)(d_00->name).gcptr64);
          if (o != (cTValue *)0x0) {
            if (o->u64 == 0xffffffffffffffff) goto LAB_00146509;
LAB_001464c5:
            if ((d_00->info & 0xf0000000) == 0x90000000) {
              lj_cconv_ct_tv(cts,cts->tab + (ushort)d_00->info,dp + d_00->size,o,flags);
            }
            else {
              lj_cconv_bf_tv(cts,d_00,dp + d_00->size,o);
            }
            bVar4 = (d->info >> 0x17 & 1) == 0;
            uVar3 = (int)(d->info << 8) >> 0x1f & 3;
            goto LAB_00146546;
          }
        }
        else {
          do {
            if (key < t->asize) {
              o = (TValue *)((ulong)key * 8 + (t->array).ptr64);
            }
            else {
              o = lj_tab_getinth(t,key);
            }
            if ((o != (cTValue *)0x0) && (o->u64 != 0xffffffffffffffff)) {
              *ip = key + 1;
              goto LAB_001464c5;
            }
            bVar4 = key == 0;
            key = 1;
          } while (bVar4);
          if (uVar1 == 0) {
            *ip = -1;
            goto LAB_001464a5;
          }
          uVar3 = 3;
        }
        bVar4 = false;
      }
LAB_00146546:
      if (bVar4) goto LAB_0014654a;
    }
    else {
      if ((d_00->info & 0xf0ff0000) == 0x80030000) {
        cconv_substruct_tab(cts,cts->tab + (ushort)d_00->info,dp + d_00->size,t,ip,flags);
      }
LAB_0014654a:
      uVar3 = 0;
    }
    if (uVar3 == 3) {
      return;
    }
  } while( true );
}

Assistant:

static void cconv_substruct_tab(CTState *cts, CType *d, uint8_t *dp,
				GCtab *t, int32_t *ip, CTInfo flags)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      TValue *tv;
      int32_t i = *ip, iz = i;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= 0) {
      retry:
	tv = (TValue *)lj_tab_getint(t, i);
	if (!tv || tvisnil(tv)) {
	  if (i == 0) { i = 1; goto retry; }  /* 1-based tables. */
	  if (iz == 0) { *ip = i = -1; goto tryname; }  /* Init named fields. */
	  break;  /* Stop at first nil. */
	}
	*ip = i + 1;
      } else {
      tryname:
	tv = (TValue *)lj_tab_getstr(t, gco2str(gcref(df->name)));
	if (!tv || tvisnil(tv)) continue;
      }
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, tv, flags);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, tv);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_tab(cts, ctype_rawchild(cts, df),
			  dp+df->size, t, ip, flags);
    }  /* Ignore all other entries in the chain. */
  }
}